

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void Js::InlineCache::VerifyRegistrationForInvalidation
               (InlineCache *cache,ScriptContext *scriptContext,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ThreadContext *pTVar5;
  undefined4 *puVar6;
  bool bVar7;
  bool local_2e;
  bool local_2d;
  int howManyRegistrations;
  bool isStoreFieldRegistered;
  bool isProtoRegistered;
  bool hasListSlotPtr;
  int howManyInvalidationsNeeded;
  bool needsStoreFieldInvalidation;
  bool needsProtoInvalidation;
  PropertyId propertyId_local;
  ScriptContext *scriptContext_local;
  InlineCache *cache_local;
  
  bVar2 = NeedsToBeRegisteredForProtoInvalidation(cache);
  bVar3 = NeedsToBeRegisteredForStoreFieldInvalidation(cache);
  bVar7 = cache->invalidationListSlotPtr != (InlineCache **)0x0;
  if (bVar7) {
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    local_2d = ThreadContext::IsProtoInlineCacheRegistered(pTVar5,cache,propertyId);
    pTVar5 = ScriptContext::GetThreadContext(scriptContext);
    local_2e = ThreadContext::IsStoreFieldInlineCacheRegistered(pTVar5,cache,propertyId);
  }
  else {
    local_2d = false;
    local_2e = false;
  }
  if (1 < (byte)(bVar2 + bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x238,"(howManyInvalidationsNeeded <= 1)",
                                "howManyInvalidationsNeeded <= 1");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((byte)(bVar2 + bVar3) != 0) && (!bVar7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x239,"((howManyInvalidationsNeeded == 0) || hasListSlotPtr)",
                                "(howManyInvalidationsNeeded == 0) || hasListSlotPtr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((bVar2) && (local_2d == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23a,"(!needsProtoInvalidation || isProtoRegistered)",
                                "!needsProtoInvalidation || isProtoRegistered");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((bVar3) && (local_2e == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23b,"(!needsStoreFieldInvalidation || isStoreFieldRegistered)",
                                "!needsStoreFieldInvalidation || isStoreFieldRegistered");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((bVar7) && ((char)(local_2d + local_2e) == '\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23c,"(!hasListSlotPtr || howManyRegistrations > 0)",
                                "!hasListSlotPtr || howManyRegistrations > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((bVar7) && (*cache->invalidationListSlotPtr != cache)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x23d,
                                "(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache)",
                                "!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void InlineCache::VerifyRegistrationForInvalidation(const InlineCache* cache, ScriptContext* scriptContext, Js::PropertyId propertyId)
    {
        bool needsProtoInvalidation = cache->NeedsToBeRegisteredForProtoInvalidation();
        bool needsStoreFieldInvalidation = cache->NeedsToBeRegisteredForStoreFieldInvalidation();
        int howManyInvalidationsNeeded = (int)needsProtoInvalidation + (int)needsStoreFieldInvalidation;
        bool hasListSlotPtr = cache->invalidationListSlotPtr != nullptr;
        bool isProtoRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsProtoInlineCacheRegistered(cache, propertyId) : false;
        bool isStoreFieldRegistered = hasListSlotPtr ? scriptContext->GetThreadContext()->IsStoreFieldInlineCacheRegistered(cache, propertyId) : false;
        int howManyRegistrations = (int)isProtoRegistered + (int)isStoreFieldRegistered;

        Assert(howManyInvalidationsNeeded <= 1);
        Assert((howManyInvalidationsNeeded == 0) || hasListSlotPtr);
        Assert(!needsProtoInvalidation || isProtoRegistered);
        Assert(!needsStoreFieldInvalidation || isStoreFieldRegistered);
        Assert(!hasListSlotPtr || howManyRegistrations > 0);
        Assert(!hasListSlotPtr || (*cache->invalidationListSlotPtr) == cache);
    }